

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O2

int lyd_merge_parent_children(lyd_node *target,lyd_node *source,int options)

{
  LYS_NODE LVar1;
  ly_ctx *ctx;
  int iVar2;
  LY_ERR *pLVar3;
  lyd_node *node2;
  lyd_node *plVar4;
  lyd_node *plVar5;
  lyd_node **pplVar6;
  lyd_node *node1;
  lyd_node *plVar7;
  lyd_node *unaff_R14;
  lyd_node *plVar8;
  bool bVar9;
  lyd_node *local_58;
  lyd_node *local_50;
  int local_34;
  
  ctx = target->schema->module->ctx;
  local_50 = source;
LAB_00158c0a:
  do {
    plVar5 = source;
    if (plVar5 == (lyd_node *)0x0) {
      local_34 = 0;
LAB_00158dbf:
      lyd_free_withsiblings(local_50);
      return local_34;
    }
    source = plVar5->next;
    node2 = plVar5;
    plVar8 = target;
LAB_00158c1f:
    do {
      if (node2 == (lyd_node *)0x0) goto LAB_00158c0a;
      plVar7 = node2;
      if ((((uint)options >> 8 & 1) == 0) || ((node2->field_0x9 & 1) == 0)) {
        pplVar6 = &plVar8->child;
        while (node1 = *pplVar6, node1 != (lyd_node *)0x0) {
          iVar2 = lyd_merge_node_equal(node1,node2);
          if (iVar2 != 0) {
            if ((node1->schema->nodetype & (LYS_ANYDATA|LYS_LEAF)) != LYS_UNKNOWN) {
              lyd_merge_node_update(node1,node2);
            }
            break;
          }
          pLVar3 = ly_errno_location();
          if (*pLVar3 != LY_SUCCESS) {
            return 1;
          }
          pplVar6 = &node1->next;
        }
        unaff_R14 = node2;
        local_58 = plVar8;
        if ((((node2->schema->nodetype & (LYS_LIST|LYS_CONTAINER)) == LYS_UNKNOWN) ||
            (node1 == (lyd_node *)0x0)) || (plVar4 = node2->child, plVar4 == (lyd_node *)0x0))
        goto LAB_00158cba;
        bVar9 = false;
LAB_00158ccf:
        while ((plVar4 == (lyd_node *)0x0 &&
               (plVar7 = plVar7->parent, plVar7->parent != plVar5->parent))) {
          plVar4 = plVar7->next;
          node1 = node1->parent;
        }
        node2 = plVar4;
        plVar8 = node1;
        if (!bVar9) goto LAB_00158c1f;
      }
      else {
        if (node2 == plVar5) goto LAB_00158c0a;
        node1 = (lyd_node *)0x1;
LAB_00158cba:
        if (node2 != plVar5) {
          plVar4 = node2->next;
          bVar9 = node1 == (lyd_node *)0x0;
          node1 = plVar8;
          goto LAB_00158ccf;
        }
        LVar1 = node2->schema->nodetype;
        if ((LVar1 == LYS_CONTAINER) ||
           ((node1 != (lyd_node *)0x0 && ((LVar1 & (LYS_ANYDATA|LYS_LEAF)) != LYS_UNKNOWN))))
        goto LAB_00158c0a;
        plVar4 = (lyd_node *)0x0;
        plVar7 = plVar5;
      }
      if (ctx == unaff_R14->schema->module->ctx) {
        lyd_unlink(unaff_R14);
      }
      else {
        unaff_R14 = lyd_dup_to_ctx(unaff_R14,1,ctx);
      }
      iVar2 = lyd_insert(local_58,unaff_R14);
      if (iVar2 != 0) {
        pLVar3 = ly_errno_location();
        *pLVar3 = LY_EINT;
        ly_log(LY_LLERR,"Internal error (%s:%d).",
               "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/tree_data.c"
               ,0x804);
        local_34 = 1;
        goto LAB_00158dbf;
      }
      node2 = plVar4;
    } while (plVar7 != plVar5);
    if (local_50 == plVar5) {
      local_50 = local_50->next;
    }
  } while( true );
}

Assistant:

static int
lyd_merge_parent_children(struct lyd_node *target, struct lyd_node *source, int options)
{
    struct lyd_node *trg_parent, *src, *src_backup, *src_elem, *src_elem_backup, *src_next, *trg_child, *trg_parent_backup;
    struct ly_ctx *ctx = target->schema->module->ctx; /* shortcut */

    LY_TREE_FOR_SAFE(source, src_backup, src) {
        for (src_elem = src_next = src, trg_parent = target;
            src_elem;
            src_elem = src_next) {

            /* it won't get inserted in this case */
            if (src_elem->dflt && (options & LYD_OPT_EXPLICIT)) {
                if (src_elem == src) {
                    /* we are done with this subtree in this case */
                    break;
                }
                trg_child = (struct lyd_node *)1;
                goto src_skip;
            }

            LY_TREE_FOR(trg_parent->child, trg_child) {
                /* schema match, data match? */
                if (lyd_merge_node_equal(trg_child, src_elem)) {
                    if (trg_child->schema->nodetype & (LYS_LEAF | LYS_ANYDATA)) {
                        lyd_merge_node_update(trg_child, src_elem);
                    }
                    break;
                } else if (ly_errno) {
                    return EXIT_FAILURE;
                }
            }

            /* first prepare for the next iteration */
            src_elem_backup = src_elem;
            trg_parent_backup = trg_parent;
            if ((src_elem->schema->nodetype & (LYS_CONTAINER | LYS_LIST)) && src_elem->child && trg_child) {
                /* go into children */
                src_next = src_elem->child;
                trg_parent = trg_child;
            } else {
src_skip:
                /* no children (or the whole subtree will be inserted), try siblings */
                if (src_elem == src) {
                    /* we are done, src has no children ... */
                    if ((src_elem->schema->nodetype == LYS_CONTAINER)
                        || ((src_elem->schema->nodetype & (LYS_LEAF | LYS_ANYDATA)) && trg_child)) {
                        /* and it's a container (empty one) or an already-updated leaf/anydata, nothing else to do */
                        break;
                    } else {
                        /* ... but we still need to insert it */
                        src_next = NULL;
                        goto src_insert;
                    }
                } else {
                    src_next = src_elem->next;
                    /* trg_parent does not change */
                }
            }
            while (!src_next) {
                src_elem = src_elem->parent;
                if (src_elem->parent == src->parent) {
                    /* we are done, no next element to process */
                    break;
                }

                /* parent is already processed, go to its sibling */
                src_next = src_elem->next;
                trg_parent = trg_parent->parent;
            }

            if (!trg_child) {
src_insert:
                /* we need to insert the whole subtree */
                if (ctx == src_elem_backup->schema->module->ctx) {
                    /* same context - unlink the subtree and insert it into the target */
                    lyd_unlink(src_elem_backup);
                } else {
                    /* different contexts - before inserting subtree, instead of unlinking, duplicate it into the
                     * target context */
                    src_elem_backup = lyd_dup_to_ctx(src_elem_backup, 1, ctx);
                }

                /* insert subtree into the target */
                if (lyd_insert(trg_parent_backup, src_elem_backup)) {
                    LOGINT;
                    lyd_free_withsiblings(source);
                    return EXIT_FAILURE;
                }
                if (src_elem == src) {
                    /* we are finished for this src, we spent it, so forget the pointer if available */
                    if (source == src) {
                        source = source->next;
                    }
                    break;
                }
            }
        }
    }

    lyd_free_withsiblings(source);
    return EXIT_SUCCESS;
}